

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

vec6F * __thiscall
crnlib::dxt_hc::palettize_color
          (vec6F *__return_storage_ptr__,dxt_hc *this,color_quad_u8 *pixels,uint pixels_count)

{
  bool bVar1;
  ushort uVar2;
  uint uVar3;
  undefined8 uVar4;
  float fVar5;
  uint i;
  ulong uVar6;
  long lVar7;
  uint size;
  ulong uVar8;
  float fVar9;
  vec3F result [2];
  vec<3U,_float> temp;
  uint color [64];
  uint weights [64];
  vec3F vectors [64];
  vec<3U,_float> local_568;
  float local_55c;
  float fStack_558;
  float local_554;
  float local_54c;
  int iStack_53c;
  ushort auStack_536 [127];
  uint local_438 [64];
  vec<3U,_float> local_338 [64];
  
  uVar8 = (ulong)pixels_count;
  if (pixels_count != 0) {
    uVar6 = 0;
    do {
      *(uint *)((long)&stack0xfffffffffffffac8 + uVar6 * 4) =
           (uint)pixels[uVar6].field_0.field_0.b |
           (uint)pixels[uVar6].field_0.field_0.g << 8 |
           (uint)pixels[uVar6].field_0.field_0.r << 0x10;
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
    lVar7 = 0x3f;
    if (uVar8 != 0) {
      for (; pixels_count >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (&stack0xfffffffffffffac8,(undefined4 *)((long)&stack0xfffffffffffffac8 + uVar8 * 4),
               ((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
              (&stack0xfffffffffffffac8,(undefined4 *)((long)&stack0xfffffffffffffac8 + uVar8 * 4));
  }
  if (pixels_count == 0) {
    size = 0;
  }
  else {
    bVar1 = (this->m_params).m_perceptual;
    uVar6 = 0;
    size = 0;
    do {
      if ((uVar6 == 0) ||
         (*(int *)((long)&stack0xfffffffffffffac8 + uVar6 * 4) != (&iStack_53c)[uVar6])) {
        uVar2 = *(ushort *)((long)local_438 + uVar6 * 4 + -0xfe);
        if ((bVar1 & 1U) == 0) {
          fVar9 = this->m_uint8_to_float[uVar2];
        }
        else {
          fVar9 = this->m_uint8_to_float[uVar2] * 0.5;
        }
        local_338[size].m_s[0] = fVar9;
        uVar3 = *(uint *)((long)&stack0xfffffffffffffac8 + uVar6 * 4);
        local_338[size].m_s[1] = this->m_uint8_to_float[uVar3 >> 8 & 0xff];
        fVar9 = this->m_uint8_to_float[uVar3 & 0xff] * 0.25;
        if ((bVar1 & 1U) == 0) {
          fVar9 = this->m_uint8_to_float[uVar3 & 0xff];
        }
        local_338[size].m_s[2] = fVar9;
        local_438[size] = 1;
        size = size + 1;
      }
      else {
        local_438[size - 1] = local_438[size - 1] + 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  split_vectors<crnlib::vec<3u,float>>
            (&local_338,&local_438,size,(vec<3U,_float> (*) [2])&local_568);
  local_54c = local_568.m_s[0] * local_568.m_s[0];
  lVar7 = 1;
  do {
    local_54c = local_54c + local_568.m_s[lVar7] * local_568.m_s[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  if (local_54c < 0.0) {
    local_54c = sqrtf(local_54c);
  }
  else {
    local_54c = SQRT(local_54c);
  }
  fVar9 = local_55c * local_55c;
  lVar7 = 4;
  do {
    fVar9 = fVar9 + local_568.m_s[lVar7] * local_568.m_s[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 6);
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  fVar5 = local_568.m_s[2];
  if (fVar9 < local_54c) {
    local_568.m_s[2] = local_554;
    uVar4._4_4_ = fStack_558;
    uVar4._0_4_ = local_55c;
    local_55c = local_568.m_s[0];
    fStack_558 = local_568.m_s[1];
    local_554 = fVar5;
    local_568.m_s._0_8_ = uVar4;
  }
  *(ulong *)(__return_storage_ptr__->m_s + 4) = CONCAT44(local_554,fStack_558);
  *(undefined8 *)__return_storage_ptr__->m_s = local_568.m_s._0_8_;
  __return_storage_ptr__->m_s[2] = local_568.m_s[2];
  __return_storage_ptr__->m_s[3] = local_55c;
  return __return_storage_ptr__;
}

Assistant:

vec6F dxt_hc::palettize_color(color_quad_u8* pixels, uint pixels_count) {
  uint color[64];
  for (uint i = 0; i < pixels_count; i++)
    color[i] = pixels[i][0] << 16 | pixels[i][1] << 8 | pixels[i][2];
  std::sort(color, color + pixels_count);
  vec3F vectors[64];
  uint weights[64];
  uint size = 0;
  for (uint i = 0; i < pixels_count; i++) {
    if (!i || color[i] != color[i - 1]) {
      vectors[size][0] = m_params.m_perceptual ? m_uint8_to_float[color[i] >> 16] * 0.5f : m_uint8_to_float[color[i] >> 16];
      vectors[size][1] = m_uint8_to_float[color[i] >> 8 & 0xFF];
      vectors[size][2] = m_params.m_perceptual ? m_uint8_to_float[color[i] & 0xFF] * 0.25f : m_uint8_to_float[color[i] & 0xFF];
      weights[size] = 1;
      size++;
    } else {
      weights[size - 1]++;
    }
  }
  vec3F result[2];
  split_vectors<vec3F>(vectors, weights, size, result);
  if (result[0].length() > result[1].length())
    utils::swap(result[0], result[1]);
  return *(vec6F*)result;
}